

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu.cxx
# Opt level: O0

int __thiscall menuwindow::early_hide_handle(menuwindow *this,int e)

{
  int my_00;
  int iVar1;
  Fl_Menu_Item *i;
  int iVar2;
  bool bVar3;
  int local_58;
  int mymenu_1;
  int item_1;
  int my;
  int mx;
  Fl_Menu_Item *m;
  menuwindow *pmStack_38;
  int item;
  menuwindow *mw;
  menustate *pmStack_28;
  int mymenu;
  menustate *pp;
  menuwindow *pmStack_18;
  int e_local;
  menuwindow *this_local;
  
  pmStack_28 = ::p;
  pp._4_4_ = e;
  pmStack_18 = this;
  switch(e) {
  case 2:
    iVar2 = Fl::event_is_click();
    if ((((iVar2 == 0) || (pmStack_28->state == 1)) ||
        ((pmStack_28->menubar != 0 &&
         ((pmStack_28->current_item != (Fl_Menu_Item *)0x0 &&
          (iVar2 = Fl_Menu_Item::submenu(pmStack_28->current_item), iVar2 == 0)))))) &&
       ((pmStack_28->current_item == (Fl_Menu_Item *)0x0 ||
        (iVar2 = Fl_Menu_Item::activevisible(pmStack_28->current_item), iVar2 != 0)))) {
      pmStack_28->state = 2;
    }
    this_local._4_4_ = 1;
    break;
  default:
switchD_00209b48_caseD_4:
    this_local._4_4_ = Fl_Window::handle((Fl_Window *)this,pp._4_4_);
    break;
  case 8:
    iVar2 = Fl::event_key();
    if (iVar2 == 0x20) {
LAB_00209dee:
      pmStack_28->state = 2;
      this_local._4_4_ = 1;
    }
    else {
      if (iVar2 != 0xff08) {
        if (iVar2 != 0xff09) {
          if (iVar2 != 0xff0d) {
            if (iVar2 == 0xff1b) {
              setitem((Fl_Menu_Item *)0x0,-1,0);
              pmStack_28->state = 2;
              return 1;
            }
            if (iVar2 == 0xff51) {
              if ((pmStack_28->menubar == 0) || (1 < pmStack_28->menu_number)) {
                if (0 < pmStack_28->menu_number) {
                  setitem(pmStack_28->menu_number + -1,
                          pmStack_28->p[pmStack_28->menu_number + -1]->selected);
                }
              }
              else {
                backward(0);
              }
              return 1;
            }
            if (iVar2 == 0xff52) {
              if ((((pmStack_28->menubar == 0) || (pmStack_28->menu_number != 0)) &&
                  (iVar2 = backward(pmStack_28->menu_number), iVar2 == 0)) &&
                 ((pmStack_28->menubar != 0 && (pmStack_28->menu_number == 1)))) {
                setitem(0,pmStack_28->p[0]->selected);
              }
              return 1;
            }
            if (iVar2 == 0xff53) {
              if ((pmStack_28->menubar == 0) ||
                 ((0 < pmStack_28->menu_number &&
                  ((pmStack_28->menu_number != 1 || (pmStack_28->nummenus != 2)))))) {
                if (pmStack_28->menu_number < pmStack_28->nummenus + -1) {
                  forward(pmStack_28->menu_number + 1);
                }
              }
              else {
                forward(0);
              }
              return 1;
            }
            if (iVar2 == 0xff54) goto LAB_00209c9d;
            if (iVar2 != 0xff8d) goto switchD_00209b48_caseD_4;
          }
          goto LAB_00209dee;
        }
        iVar2 = Fl::event_shift();
        if (iVar2 == 0) {
LAB_00209c9d:
          if ((pmStack_28->menu_number == 0) && (pmStack_28->menubar != 0)) {
            if (pmStack_28->menu_number < pmStack_28->nummenus + -1) {
              forward(pmStack_28->menu_number + 1);
            }
          }
          else {
            iVar2 = forward(pmStack_28->menu_number);
            if ((iVar2 == 0) && (iVar2 = Fl::event_key(), iVar2 == 0xff09)) {
              pmStack_28->item_number = -1;
              forward(pmStack_28->menu_number);
            }
          }
          return 1;
        }
      }
      iVar2 = backward(pmStack_28->menu_number);
      if (iVar2 == 0) {
        pmStack_28->item_number = -1;
        backward(pmStack_28->menu_number);
      }
      this_local._4_4_ = 1;
    }
    break;
  case 0xb:
    if (::p->state == 2) {
      return 1;
    }
  case 1:
  case 3:
  case 5:
    iVar2 = Fl::event_x_root();
    my_00 = Fl::event_y_root();
    if (((pmStack_28->menubar == 0) || (pmStack_28->nummenus != 1)) &&
       (iVar1 = menustate::is_inside(pmStack_28,iVar2,my_00), iVar1 == 0)) {
      setitem((Fl_Menu_Item *)0x0,-1,0);
      if (pp._4_4_ == 1) {
        pmStack_28->state = 2;
      }
      this_local._4_4_ = 1;
    }
    else {
      local_58 = pmStack_28->nummenus;
      do {
        local_58 = local_58 + -1;
        iVar1 = find_selected(pmStack_28->p[local_58],iVar2,my_00);
        if (-1 < iVar1) {
          if ((my_00 == 0) && (0 < iVar1)) {
            setitem(local_58,iVar1 + -1);
          }
          else {
            setitem(local_58,iVar1);
          }
          if (pp._4_4_ == 1) {
            if (((pmStack_28->current_item == (Fl_Menu_Item *)0x0) ||
                (iVar2 = Fl_Menu_Item::submenu(pmStack_28->current_item), iVar2 == 0)) ||
               ((iVar1 == pmStack_28->p[local_58]->selected ||
                (pmStack_28->current_item->callback_ != (Fl_Callback *)0x0)))) {
              pmStack_28->state = 1;
            }
            else {
              pmStack_28->state = 3;
            }
          }
          return 1;
        }
      } while (0 < local_58);
      if ((pmStack_28->menu_number == -1) && (pp._4_4_ == 1)) {
        pmStack_28->state = 2;
        this_local._4_4_ = 1;
      }
      else if ((pmStack_28->current_item == (Fl_Menu_Item *)0x0) ||
              ((pmStack_28->menu_number != 0 ||
               (iVar2 = Fl_Menu_Item::submenu(pmStack_28->current_item), iVar2 != 0)))) {
        this_local._4_4_ = 0;
      }
      else {
        if (pp._4_4_ == 1) {
          pmStack_28->state = 2;
        }
        setitem((Fl_Menu_Item *)0x0,-1,0);
        this_local._4_4_ = 1;
      }
    }
    break;
  case 0xc:
    mw._4_4_ = ::p->nummenus;
    do {
      iVar2 = mw._4_4_ + -1;
      bVar3 = mw._4_4_ == 0;
      mw._4_4_ = iVar2;
      if (bVar3) goto switchD_00209b48_caseD_4;
      pmStack_38 = pmStack_28->p[iVar2];
      i = Fl_Menu_Item::find_shortcut(pmStack_38->menu,(int *)((long)&m + 4),false);
    } while (i == (Fl_Menu_Item *)0x0);
    setitem(i,mw._4_4_,m._4_4_);
    iVar2 = Fl_Menu_Item::submenu(i);
    if (iVar2 == 0) {
      pmStack_28->state = 2;
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int menuwindow::early_hide_handle(int e) {
#endif
  menustate &pp = *p;
  switch (e) {
  case FL_KEYBOARD:
    switch (Fl::event_key()) {
    case FL_BackSpace:
    BACKTAB:
      if (!backward(pp.menu_number)) {pp.item_number = -1;backward(pp.menu_number);}
      return 1;
    case FL_Up:
      if (pp.menubar && pp.menu_number == 0) {
        // Do nothing...
      } else if (backward(pp.menu_number)) {
        // Do nothing...
      } else if (pp.menubar && pp.menu_number==1) {
        setitem(0, pp.p[0]->selected);
      }
      return 1;
    case FL_Tab:
      if (Fl::event_shift()) goto BACKTAB;
    case FL_Down:
      if (pp.menu_number || !pp.menubar) {
        if (!forward(pp.menu_number) && Fl::event_key()==FL_Tab) {
          pp.item_number = -1;
          forward(pp.menu_number);
        }
      } else if (pp.menu_number < pp.nummenus-1) {
        forward(pp.menu_number+1);
      }
      return 1;
    case FL_Right:
      if (pp.menubar && (pp.menu_number<=0 || (pp.menu_number==1 && pp.nummenus==2)))
	forward(0);
      else if (pp.menu_number < pp.nummenus-1) forward(pp.menu_number+1);
      return 1;
    case FL_Left:
      if (pp.menubar && pp.menu_number<=1) backward(0);
      else if (pp.menu_number>0)
	setitem(pp.menu_number-1, pp.p[pp.menu_number-1]->selected);
      return 1;
    case FL_Enter:
    case FL_KP_Enter:
    case ' ':
      pp.state = DONE_STATE;
      return 1;
    case FL_Escape:
      setitem(0, -1, 0);
      pp.state = DONE_STATE;
      return 1;
    }
    break;
  case FL_SHORTCUT: 
    {
      for (int mymenu = pp.nummenus; mymenu--;) {
	menuwindow &mw = *(pp.p[mymenu]);
	int item; const Fl_Menu_Item* m = mw.menu->find_shortcut(&item);
	if (m) {
	  setitem(m, mymenu, item);
	  if (!m->submenu()) pp.state = DONE_STATE;
	  return 1;
	}
      }
    }
    break;
    case FL_MOVE:
#if ! (defined(WIN32) || defined(__APPLE__))
      if (pp.state == DONE_STATE) {
	return 1; // Fix for STR #2619
      }
      /* FALLTHROUGH */
#endif
  case FL_ENTER:
  case FL_PUSH:
  case FL_DRAG:
    {
      int mx = Fl::event_x_root();
      int my = Fl::event_y_root();
      int item=0; int mymenu = pp.nummenus-1;
      // Clicking or dragging outside menu cancels it...
      if ((!pp.menubar || mymenu) && !pp.is_inside(mx, my)) {
	setitem(0, -1, 0);
	if (e==FL_PUSH)
	  pp.state = DONE_STATE;
	return 1;
      }
      for (mymenu = pp.nummenus-1; ; mymenu--) {
	item = pp.p[mymenu]->find_selected(mx, my);
	if (item >= 0) 
	  break;
	if (mymenu <= 0) {
	  // buttons in menubars must be deselected if we move outside of them!
	  if (pp.menu_number==-1 && e==FL_PUSH) {
	    pp.state = DONE_STATE;
	    return 1;
	  }
	  if (pp.current_item && pp.menu_number==0 && !pp.current_item->submenu()) {
	    if (e==FL_PUSH)
	      pp.state = DONE_STATE;
	    setitem(0, -1, 0);
	    return 1;
	  }
	  // all others can stay selected
	  return 0;
	}
      }
      if (my == 0 && item > 0) setitem(mymenu, item - 1);
      else setitem(mymenu, item);
      if (e == FL_PUSH) {
	if (pp.current_item && pp.current_item->submenu() // this is a menu title
	    && item != pp.p[mymenu]->selected // and it is not already on
	    && !pp.current_item->callback_) // and it does not have a callback
	  pp.state = MENU_PUSH_STATE;
	else
	  pp.state = PUSH_STATE;
      }
    }
    return 1;
  case FL_RELEASE:
    // Mouse must either be held down/dragged some, or this must be
    // the second click (not the one that popped up the menu):
    if (   !Fl::event_is_click() 
        || pp.state == PUSH_STATE 
        || (pp.menubar && pp.current_item && !pp.current_item->submenu()) // button
	) {
#if 0 // makes the check/radio items leave the menu up
      const Fl_Menu_Item* m = pp.current_item;
      if (m && button && (m->flags & (FL_MENU_TOGGLE|FL_MENU_RADIO))) {
	((Fl_Menu_*)button)->picked(m);
	pp.p[pp.menu_number]->redraw();
      } else
#endif
      // do nothing if they try to pick inactive items
      if (!pp.current_item || pp.current_item->activevisible())
	pp.state = DONE_STATE;
    }
    return 1;
  }
  return Fl_Window::handle(e);
}